

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_mul_shortcuts
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi *X;
  
  iVar1 = mbedtls_mpi_cmp_int(m,1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_copy(R,P);
    return iVar1;
  }
  iVar1 = mbedtls_mpi_cmp_int(m,-1);
  if (iVar1 != 0) {
    iVar1 = mbedtls_ecp_mul(grp,R,m,P,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
    return iVar1;
  }
  iVar1 = mbedtls_ecp_copy(R,P);
  if (iVar1 == 0) {
    X = &R->Y;
    iVar1 = 0;
    iVar2 = mbedtls_mpi_cmp_int(X,0);
    if (iVar2 != 0) {
      iVar1 = mbedtls_mpi_sub_mpi(X,&grp->P,X);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int mbedtls_ecp_mul_shortcuts( mbedtls_ecp_group *grp,
                                      mbedtls_ecp_point *R,
                                      const mbedtls_mpi *m,
                                      const mbedtls_ecp_point *P )
{
    int ret;

    if( mbedtls_mpi_cmp_int( m, 1 ) == 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_ecp_copy( R, P ) );
    }
    else if( mbedtls_mpi_cmp_int( m, -1 ) == 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_ecp_copy( R, P ) );
        if( mbedtls_mpi_cmp_int( &R->Y, 0 ) != 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &R->Y, &grp->P, &R->Y ) );
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_ecp_mul( grp, R, m, P, NULL, NULL ) );
    }

cleanup:
    return( ret );
}